

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

bool __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::filter::operator()
          (void *this,size_t level,
          array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *path)

{
  long lVar1;
  string_view input;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  string_view input_00;
  string_view pattern;
  
  uVar6 = level + 1;
  uVar4 = *(long *)((long)this + 8) - (long)*this >> 4;
  if (uVar6 <= uVar4) {
    uVar4 = uVar6;
  }
  bVar7 = uVar4 == 0;
  if ((!bVar7) &&
     (input._M_len = path->_M_elems[0]._M_len, input._M_str = path->_M_elems[0]._M_str,
     bVar2 = utility::is_match(input,**this), bVar2)) {
    uVar3 = 1;
    do {
      uVar5 = (ulong)uVar3;
      lVar1 = *this;
      uVar4 = *(long *)((long)this + 8) - lVar1 >> 4;
      if (uVar6 <= uVar4) {
        uVar4 = uVar6;
      }
      bVar7 = uVar4 <= uVar5;
      if (uVar4 <= uVar5) {
        return bVar7;
      }
      input_00._M_str = path->_M_elems[uVar5]._M_str;
      input_00._M_len = path->_M_elems[uVar5]._M_len;
      pattern._M_str = *(char **)(lVar1 + 8 + uVar5 * 0x10);
      pattern._M_len = *(size_t *)(lVar1 + uVar5 * 0x10);
      bVar2 = utility::is_match(input_00,pattern);
      uVar3 = uVar3 + 1;
    } while (bVar2);
  }
  return bVar7;
}

Assistant:

constexpr auto operator()(const std::size_t level,
                                const TPath& path) const -> bool {
        for (auto i = 0u; i < math::min_value(level + 1, std::size(path_));
             ++i) {
          if (not utility::is_match(path[i], path_[i])) {
            return false;
          }
        }
        return true;
      }